

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void __thiscall QPDF::decryptString(QPDF *this,string *str,QPDFObjGen og)

{
  bool bVar1;
  uint uVar2;
  pointer pMVar3;
  element_type *peVar4;
  uchar *key_00;
  size_t sVar5;
  RC4_KEY *pRVar6;
  pointer pcVar7;
  QPDFObjGen og_00;
  allocator *indata;
  size_t len;
  uchar *in_R8;
  QPDFExc *anon_var_0;
  runtime_error *e;
  undefined1 local_268 [40];
  uchar *data;
  undefined1 local_238 [8];
  RC4 rc4;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp;
  size_t vlen;
  undefined1 local_1f8 [8];
  Pl_AES_PDF pl;
  Pl_Buffer bufpl;
  shared_ptr<QPDF::EncryptionParameters> local_110;
  undefined1 local_100 [8];
  string key;
  allocator<char> local_c9;
  string local_c8;
  QPDFExc local_a8;
  byte local_21;
  string *psStack_20;
  bool use_aes;
  string *str_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  psStack_20 = str;
  str_local = (string *)this;
  this_local = (QPDF *)og;
  bVar1 = QPDFObjGen::isIndirect((QPDFObjGen *)&this_local);
  if (bVar1) {
    local_21 = 0;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar3->encp);
    if (3 < peVar4->encryption_V) {
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar3->encp);
      switch(peVar4->cf_string) {
      case e_none:
        return;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   "unknown encryption filter for strings (check /StrF in /Encrypt dictionary); strings may be decrypted improperly"
                   ,&local_c9);
        damagedPDF(&local_a8,this,&local_c8);
        warn(this,&local_a8);
        QPDFExc::~QPDFExc(&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar4 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar3->encp);
        peVar4->cf_string = e_aes;
        local_21 = 1;
        break;
      case e_rc4:
        break;
      case e_aes:
        local_21 = 1;
        break;
      case e_aesv3:
        local_21 = 1;
      }
    }
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_110,&pMVar3->encp);
    og_00.obj = local_21 & 1;
    og_00.gen = 0;
    getKeyForObject_abi_cxx11_
              ((string *)local_100,(QPDF *)&local_110,
               (shared_ptr<QPDF::EncryptionParameters> *)this_local,og_00,SUB81(in_R8,0));
    std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_110);
    if ((local_21 & 1) == 0) {
      QTC::TC("qpdf","QPDF_encryption rc4 decode string",0);
      sVar5 = std::__cxx11::string::length();
      QUtil::make_unique_cstr
                ((QUtil *)&rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,psStack_20);
      pRVar6 = (RC4_KEY *)QUtil::unsigned_char_pointer((string *)local_100);
      data = (uchar *)std::__cxx11::string::length();
      uVar2 = toI<unsigned_long>((unsigned_long *)&data);
      RC4::RC4((RC4 *)local_238,pRVar6,(ulong)uVar2,(uchar *)og_00,in_R8);
      pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                         ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                          &rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
      local_268._32_8_ = QUtil::unsigned_char_pointer(pcVar7);
      RC4::process((RC4 *)local_238,(uchar *)local_268._32_8_,sVar5,(uchar *)local_268._32_8_);
      pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                         ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                          &rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
      indata = (allocator *)((long)&e + 7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_268,pcVar7,sVar5,indata);
      pRVar6 = (RC4_KEY *)local_268;
      std::__cxx11::string::operator=((string *)psStack_20,(string *)pRVar6);
      std::__cxx11::string::~string((string *)local_268);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      RC4::~RC4((RC4 *)local_238,pRVar6,len,(uchar *)indata,in_R8);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                 &rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      QTC::TC("qpdf","QPDF_encryption aes decode string",0);
      Pl_Buffer::Pl_Buffer((Pl_Buffer *)&pl.use_zero_iv,"decrypted string",(Pipeline *)0x0);
      key_00 = QUtil::unsigned_char_pointer((string *)local_100);
      sVar5 = std::__cxx11::string::length();
      Pl_AES_PDF::Pl_AES_PDF
                ((Pl_AES_PDF *)local_1f8,"aes decrypt string",(Pipeline *)&pl.use_zero_iv,false,
                 key_00,sVar5);
      Pipeline::writeString((Pipeline *)local_1f8,psStack_20);
      Pl_AES_PDF::finish((Pl_AES_PDF *)local_1f8);
      Pl_Buffer::getString_abi_cxx11_((string *)&vlen,(Pl_Buffer *)&pl.use_zero_iv);
      std::__cxx11::string::operator=((string *)psStack_20,(string *)&vlen);
      std::__cxx11::string::~string((string *)&vlen);
      Pl_AES_PDF::~Pl_AES_PDF((Pl_AES_PDF *)local_1f8);
      Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&pl.use_zero_iv);
    }
    std::__cxx11::string::~string((string *)local_100);
  }
  return;
}

Assistant:

void
QPDF::decryptString(std::string& str, QPDFObjGen og)
{
    if (!og.isIndirect()) {
        return;
    }
    bool use_aes = false;
    if (m->encp->encryption_V >= 4) {
        switch (m->encp->cf_string) {
        case e_none:
            return;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            warn(damagedPDF(
                "unknown encryption filter for strings (check /StrF in "
                "/Encrypt dictionary); strings may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_string.  Assume we'd want to use AES if V == 4.
            m->encp->cf_string = e_aes;
            use_aes = true;
            break;
        }
    }

    std::string key = getKeyForObject(m->encp, og, use_aes);
    try {
        if (use_aes) {
            QTC::TC("qpdf", "QPDF_encryption aes decode string");
            Pl_Buffer bufpl("decrypted string");
            Pl_AES_PDF pl(
                "aes decrypt string",
                &bufpl,
                false,
                QUtil::unsigned_char_pointer(key),
                key.length());
            pl.writeString(str);
            pl.finish();
            str = bufpl.getString();
        } else {
            QTC::TC("qpdf", "QPDF_encryption rc4 decode string");
            size_t vlen = str.length();
            // Using std::shared_ptr guarantees that tmp will be freed even if rc4.process throws an
            // exception.
            auto tmp = QUtil::make_unique_cstr(str);
            RC4 rc4(QUtil::unsigned_char_pointer(key), toI(key.length()));
            auto data = QUtil::unsigned_char_pointer(tmp.get());
            rc4.process(data, vlen, data);
            str = std::string(tmp.get(), vlen);
        }
    } catch (QPDFExc&) {
        throw;
    } catch (std::runtime_error& e) {
        throw damagedPDF("error decrypting string for object " + og.unparse() + ": " + e.what());
    }
}